

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O0

void CLineInput::RenderCandidates(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long in_FS_OFFSET;
  float fVar6;
  float fVar7;
  vector2_base<float> vVar8;
  CTextBoundingBox CVar9;
  CTextBoundingBox BoundingBox;
  int i;
  float SelectedCandidateY;
  vec2 Position;
  int ScreenHeight;
  int ScreenWidth;
  float Width;
  float Height;
  float VMargin;
  float HMargin;
  float FontSize;
  CQuadItem Quad;
  char aBuf [8];
  vec2 in_stack_ffffffffffffff28;
  CTextCursor *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  CTextCursor *in_stack_ffffffffffffff40;
  vector2_base<float> *this;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_ac;
  float fStack_a8;
  float local_a4;
  float fStack_a0;
  uint local_9c;
  float local_98;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_94;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_90;
  CQuadItem local_60;
  CQuadItem local_50;
  CQuadItem local_40;
  vector2_base<float> local_30;
  char local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (*(s_pInput->super_IInterface)._vptr_IInterface[0x12])();
  if (((uVar1 & 1) != 0) &&
     (iVar2 = (*(s_pInput->super_IInterface)._vptr_IInterface[0x17])(), iVar2 != 0)) {
    fVar6 = IGraphics::ScreenAspect((IGraphics *)in_stack_ffffffffffffff30);
    fVar6 = fVar6 * 300.0;
    iVar2 = IGraphics::ScreenWidth(s_pGraphics);
    iVar3 = IGraphics::ScreenHeight(s_pGraphics);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[5])(0,0,fVar6,0x43960000);
    if ((RenderCandidates()::s_CandidateCursor == '\0') &&
       (iVar4 = __cxa_guard_acquire(&RenderCandidates()::s_CandidateCursor), iVar4 != 0)) {
      CTextCursor::CTextCursor(in_stack_ffffffffffffff40);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderCandidates::s_CandidateCursor,&__dso_handle);
      __cxa_guard_release(&RenderCandidates()::s_CandidateCursor);
    }
    CTextCursor::Reset(in_stack_ffffffffffffff30,(int64)in_stack_ffffffffffffff28);
    RenderCandidates::s_CandidateCursor.m_FontSize = 7.0;
    RenderCandidates::s_CandidateCursor.m_LineSpacing = 2.45;
    RenderCandidates::s_CandidateCursor.m_MaxLines = -1;
    this = (vector2_base<float> *)&stack0xffffffffffffffe0;
    vector2_base<float>::vector2_base(this,(float)iVar2,(float)iVar3);
    vector2_base<float>::operator/
              (this,(vector2_base<float> *)
                    CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    vector2_base<float>::vector2_base((vector2_base<float> *)&stack0xffffffffffffffd8,fVar6,300.0);
    vVar8 = vector2_base<float>::operator*
                      (this,(vector2_base<float> *)
                            CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_98 = 0.0;
    local_9c = 0;
    while (uVar1 = local_9c, iVar2 = (*(s_pInput->super_IInterface)._vptr_IInterface[0x17])(),
          (int)uVar1 < iVar2) {
      uVar1 = local_9c;
      uVar5 = (*(s_pInput->super_IInterface)._vptr_IInterface[0x18])();
      if (uVar1 == uVar5) {
        local_98 = CTextCursor::Height(&RenderCandidates::s_CandidateCursor);
      }
      if (0 < (int)local_9c) {
        (*(s_pTextRender->super_IInterface)._vptr_IInterface[8])
                  (s_pTextRender,&RenderCandidates::s_CandidateCursor);
      }
      str_format(local_10,8,"%d. ",(long)(int)(local_9c + 1) % 10 & 0xffffffff);
      (*(s_pTextRender->super_IInterface)._vptr_IInterface[4])
                (0x3f19999a,0x3f19999a,0x3f19999a,0x3f800000);
      (*(s_pTextRender->super_IInterface)._vptr_IInterface[7])
                (s_pTextRender,&RenderCandidates::s_CandidateCursor,local_10,0xffffffff);
      (*(s_pTextRender->super_IInterface)._vptr_IInterface[4])(0x3f800000,0x3f800000,0x3f800000);
      in_stack_ffffffffffffff30 = (CTextCursor *)s_pTextRender;
      iVar2 = (*(s_pInput->super_IInterface)._vptr_IInterface[0x16])(s_pInput,(ulong)local_9c);
      (**(code **)(*(long *)in_stack_ffffffffffffff30 + 0x38))
                (in_stack_ffffffffffffff30,&RenderCandidates::s_CandidateCursor,iVar2,0xffffffff);
      local_9c = local_9c + 1;
    }
    CVar9 = CTextCursor::BoundingBox(in_stack_ffffffffffffff30);
    local_94 = vVar8.field_0;
    aStack_90 = vVar8.field_1;
    local_a4 = CVar9.w;
    fStack_a0 = CVar9.h;
    local_a4 = local_a4 + 8.0;
    local_ac = vVar8.field_0;
    fStack_a8 = vVar8.field_1;
    fVar7 = fStack_a0 + 4.0;
    fStack_a0 = fVar7;
    if (300.0 < aStack_90.y + 94.5) {
      fStack_a8 = aStack_90.y - ((s_CompositionLineHeight / (float)iVar3) * 300.0 + fVar7);
      local_ac = local_94;
    }
    if (fVar6 < local_ac.x + local_a4 + 8.0) {
      fVar7 = local_ac.x + local_a4;
      local_ac.x = local_ac.x - ((fVar7 + 8.0) - fVar6);
    }
    vector2_base<float>::vector2_base(&local_30,local_ac.x + 4.0,fStack_a8 + 2.0);
    CTextCursor::MoveTo((CTextCursor *)0x1d5366,in_stack_ffffffffffffff28);
    IGraphics::TextureClear((IGraphics *)in_stack_ffffffffffffff30);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[8])();
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])(0,0,0,0x3f4ccccd);
    IGraphics::CQuadItem::CQuadItem(&local_40,local_ac.x + 0.75,fStack_a8 + 0.75,local_a4,fStack_a0)
    ;
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_40,1);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])
              (0x3e19999a,0x3e19999a,0x3e19999a,0x3f800000);
    IGraphics::CQuadItem::CQuadItem(&local_50,(float)local_ac,fStack_a8,local_a4,fStack_a0);
    local_40.m_X = local_50.m_X;
    local_40.m_Y = local_50.m_Y;
    local_40.m_Width = local_50.m_Width;
    local_40.m_Height = local_50.m_Height;
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_40,1);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])
              (0x3dcccccd,0x3ecccccd,0x3f4ccccd,0x3f800000);
    IGraphics::CQuadItem::CQuadItem
              (&local_60,local_ac.x + 2.0,fStack_a8 + 2.0 + local_98,local_a4 - 4.0,9.45);
    local_40.m_X = local_60.m_X;
    local_40.m_Y = local_60.m_Y;
    local_40.m_Width = local_60.m_Width;
    local_40.m_Height = local_60.m_Height;
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_40,1);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
    (*(s_pTextRender->super_IInterface)._vptr_IInterface[0x10])
              (0x3f800000,s_pTextRender,&RenderCandidates::s_CandidateCursor,0,0xffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CLineInput::RenderCandidates()
{
	if(!s_pInput->HasComposition() || !s_pInput->GetCandidateCount())
		return;

	const float FontSize = 7.0f;
	const float HMargin = 8.0f;
	const float VMargin = 4.0f;
	const float Height = 300;
	const float Width = Height*s_pGraphics->ScreenAspect();
	const int ScreenWidth = s_pGraphics->ScreenWidth();
	const int ScreenHeight = s_pGraphics->ScreenHeight();

	s_pGraphics->MapScreen(0, 0, Width, Height);

	static CTextCursor s_CandidateCursor;
	s_CandidateCursor.Reset();
	s_CandidateCursor.m_FontSize = FontSize;
	s_CandidateCursor.m_LineSpacing = FontSize*0.35f;
	s_CandidateCursor.m_MaxLines = -1;

	vec2 Position = s_CompositionWindowPosition / vec2(ScreenWidth, ScreenHeight) * vec2(Width, Height);
	float SelectedCandidateY = 0;
	for(int i = 0; i < s_pInput->GetCandidateCount(); ++i)
	{
		if(i == s_pInput->GetCandidateSelectedIndex())
			SelectedCandidateY = s_CandidateCursor.Height();

		if(i > 0)
			s_pTextRender->TextNewline(&s_CandidateCursor);

		char aBuf[8];
		str_format(aBuf, sizeof(aBuf), "%d. ", (i+1)%10);

		s_pTextRender->TextColor(0.6f, 0.6f, 0.6f, 1.0f);
		s_pTextRender->TextDeferred(&s_CandidateCursor, aBuf, -1);
		s_pTextRender->TextColor(1.0f, 1.0f, 1.0f, 1.0f);
		s_pTextRender->TextDeferred(&s_CandidateCursor, s_pInput->GetCandidate(i), -1);
	}

	CTextBoundingBox BoundingBox = s_CandidateCursor.BoundingBox();
	BoundingBox.x = Position.x;
	BoundingBox.y = Position.y;
	BoundingBox.w += HMargin;
	BoundingBox.h += VMargin;

	// move candidate window up if needed
	if(BoundingBox.y + FontSize * 13.5f > Height)
		BoundingBox.y -= BoundingBox.h + s_CompositionLineHeight / ScreenHeight * Height;

	// move candidate window left if needed
	if(BoundingBox.x + BoundingBox.w + HMargin > Width)
		BoundingBox.x -= BoundingBox.x + BoundingBox.w + HMargin - Width;

	s_CandidateCursor.MoveTo(vec2(BoundingBox.x+HMargin/2, BoundingBox.y+VMargin/2));

	s_pGraphics->TextureClear();
	s_pGraphics->QuadsBegin();
	s_pGraphics->BlendNormal();

	// window shadow
	s_pGraphics->SetColor(0.0f, 0.0f, 0.0f, 0.8f);
	IGraphics::CQuadItem Quad = IGraphics::CQuadItem(BoundingBox.x+0.75f, BoundingBox.y+0.75f, BoundingBox.w, BoundingBox.h);
	s_pGraphics->QuadsDrawTL(&Quad, 1);

	// window background
	s_pGraphics->SetColor(0.15f, 0.15f, 0.15f, 1.0f);
	Quad = IGraphics::CQuadItem(BoundingBox.x, BoundingBox.y, BoundingBox.w, BoundingBox.h);
	s_pGraphics->QuadsDrawTL(&Quad, 1);

	// highlight
	s_pGraphics->SetColor(0.1f, 0.4f, 0.8f, 1.0f);
	Quad = IGraphics::CQuadItem(BoundingBox.x+HMargin/4, BoundingBox.y+VMargin/2+SelectedCandidateY, BoundingBox.w-HMargin/2, FontSize*1.35f);
	s_pGraphics->QuadsDrawTL(&Quad, 1);
	s_pGraphics->QuadsEnd();

	s_pTextRender->DrawTextOutlined(&s_CandidateCursor);
}